

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsCore helicsFederateGetCore(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  pointer pCVar1;
  element_type *this_00;
  void *retcore;
  __single_object core;
  Federate *fedObj;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff78;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff80;
  HelicsError *in_stack_ffffffffffffff88;
  HelicsFederate in_stack_ffffffffffffff90;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
  *in_stack_ffffffffffffffb8;
  MasterObjectHolder *local_8;
  
  this = getFed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (this == (Federate *)0x0) {
    local_8 = (MasterObjectHolder *)0x0;
  }
  else {
    std::make_unique<helics::CoreObject>();
    pCVar1 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::
             operator->((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        0x1bb447);
    pCVar1->valid = 0x378424ec;
    helics::Federate::getCorePointer(this);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::operator->
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)0x1bb46e)
    ;
    std::shared_ptr<helics::Core>::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_8 = (MasterObjectHolder *)
              std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::get
                        ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *
                         )in_stack_ffffffffffffff80);
    getMasterHolder();
    this_00 = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bb4a0);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this_00,
               (unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
               in_stack_ffffffffffffff78);
    MasterObjectHolder::addCore(local_8,in_stack_ffffffffffffffb8);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this_00);
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bb4de);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this_00);
  }
  return local_8;
}

Assistant:

HelicsCore helicsFederateGetCore(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    auto core = std::make_unique<helics::CoreObject>();
    core->valid = gCoreValidationIdentifier;
    core->coreptr = fedObj->getCorePointer();
    auto* retcore = reinterpret_cast<HelicsCore>(core.get());
    getMasterHolder()->addCore(std::move(core));
    return retcore;
}